

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall capnp::DynamicValue::Builder::Builder(Builder *this,Builder *other)

{
  int64_t iVar1;
  char *pcVar2;
  size_t sVar3;
  CapTableBuilder *pCVar4;
  byte *pbVar5;
  BitsPerElementN<23> BVar6;
  StructDataBitCount SVar7;
  StructPointerCount SVar8;
  ElementSize EVar9;
  undefined1 uVar10;
  Type TVar11;
  undefined4 uVar12;
  
  if (other->type == CAPABILITY) {
    this->type = CAPABILITY;
    (*(code *)(((other->field_1).structValue.builder.segment)->super_SegmentReader).arena[4].
              _vptr_Arena)(&this->field_1);
    (this->field_1).textValue.content.size_ = (other->field_1).textValue.content.size_;
  }
  else {
    TVar11 = other->type;
    uVar12 = *(undefined4 *)&other->field_0x4;
    iVar1 = (other->field_1).intValue;
    pcVar2 = (other->field_1).textValue.content.ptr;
    sVar3 = (other->field_1).textValue.content.size_;
    pCVar4 = (other->field_1).listValue.builder.capTable;
    pbVar5 = (other->field_1).listValue.builder.ptr;
    BVar6 = *(BitsPerElementN<23> *)((long)&other->field_1 + 0x2c);
    SVar7 = *(StructDataBitCount *)((long)&other->field_1 + 0x30);
    SVar8 = *(StructPointerCount *)((long)&other->field_1 + 0x34);
    EVar9 = *(ElementSize *)((long)&other->field_1 + 0x36);
    uVar10 = *(undefined1 *)((long)&other->field_1 + 0x37);
    *(ListElementCount *)((long)&this->field_1 + 0x28) =
         *(ListElementCount *)((long)&other->field_1 + 0x28);
    *(BitsPerElementN<23> *)((long)&this->field_1 + 0x2c) = BVar6;
    *(StructDataBitCount *)((long)&this->field_1 + 0x30) = SVar7;
    *(StructPointerCount *)((long)&this->field_1 + 0x34) = SVar8;
    *(ElementSize *)((long)&this->field_1 + 0x36) = EVar9;
    *(undefined1 *)((long)&this->field_1 + 0x37) = uVar10;
    (this->field_1).listValue.builder.capTable = pCVar4;
    (this->field_1).listValue.builder.ptr = pbVar5;
    (this->field_1).textValue.content.ptr = pcVar2;
    (this->field_1).textValue.content.size_ = sVar3;
    this->type = TVar11;
    *(undefined4 *)&this->field_0x4 = uVar12;
    (this->field_1).intValue = iVar1;
  }
  return;
}

Assistant:

DynamicValue::Builder::Builder(Builder& other) {
  switch (other.type) {
    case UNKNOWN:
    case VOID:
    case BOOL:
    case INT:
    case UINT:
    case FLOAT:
    case TEXT:
    case DATA:
    case LIST:
    case ENUM:
    case STRUCT:
    case ANY_POINTER:
      // Unfortunately canMemcpy() doesn't work on these types due to the use of
      // DisallowConstCopy, but __has_trivial_destructor should detect if any of these types
      // become non-trivial.
      static_assert(__has_trivial_destructor(Text::Builder) &&
                    __has_trivial_destructor(Data::Builder) &&
                    __has_trivial_destructor(DynamicList::Builder) &&
                    __has_trivial_destructor(DynamicEnum) &&
                    __has_trivial_destructor(DynamicStruct::Builder) &&
                    __has_trivial_destructor(AnyPointer::Builder),
                    "Assumptions here don't hold.");
      break;

    case CAPABILITY:
      type = CAPABILITY;
      kj::ctor(capabilityValue, other.capabilityValue);
      return;
  }

  memcpy(this, &other, sizeof(*this));
}